

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

nng_err nni_http_set_uri(nng_http *conn,char *uri,char *query)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *local_38;
  char *fmt;
  size_t needed;
  char *query_local;
  char *uri_local;
  nng_http *conn_local;
  
  if (query == (char *)0x0) {
    local_38 = "%s%s";
    needed = (long)"%s: %s\r\n" + 8;
    fmt = (char *)strlen(uri);
  }
  else {
    pcVar2 = strchr(uri,0x3f);
    local_38 = "%s?%s";
    if (pcVar2 != (char *)0x0) {
      local_38 = "%s&%s";
    }
    sVar3 = strlen(uri);
    sVar4 = strlen(query);
    fmt = (char *)(sVar3 + sVar4 + 1);
    needed = (size_t)query;
  }
  if (((conn->uri != (char *)0x0) && (iVar1 = strcmp(uri,conn->uri), iVar1 == 0)) &&
     (sVar3 = strlen((char *)needed), sVar3 == 0)) {
    return NNG_OK;
  }
  if ((conn->uri != (char *)0x0) && (conn->uri != conn->ubuf)) {
    nni_strfree(conn->uri);
  }
  if (fmt < (char *)0xc8) {
    snprintf(conn->ubuf,200,local_38,uri,needed);
    conn->uri = conn->ubuf;
    conn_local._4_4_ = NNG_OK;
  }
  else {
    iVar1 = nni_asprintf(&conn->uri,local_38,uri,needed);
    if (iVar1 == 0) {
      conn_local._4_4_ = NNG_OK;
    }
    else {
      conn_local._4_4_ = NNG_ENOMEM;
    }
  }
  return conn_local._4_4_;
}

Assistant:

nng_err
nni_http_set_uri(nng_http *conn, const char *uri, const char *query)
{
	size_t      needed;
	const char *fmt;

	if (query != NULL) {
		fmt    = strchr(uri, '?') != NULL ? "%s&%s" : "%s?%s";
		needed = strlen(uri) + strlen(query) + 1;
	} else {
		fmt    = "%s%s";
		query  = "";
		needed = strlen(uri);
	}

	if (conn->uri != NULL && (strcmp(uri, conn->uri) == 0) &&
	    strlen(query) == 0) {
		// no change, do nothing
		return (NNG_OK);
	}
	if (conn->uri != NULL && conn->uri != conn->ubuf) {
		nni_strfree(conn->uri);
	}

	// fast path, small size URI fits in our buffer
	if (needed < sizeof(conn->ubuf)) {
		snprintf(conn->ubuf, sizeof(conn->ubuf), fmt, uri, query);
		conn->uri = conn->ubuf;
		return (NNG_OK);
	}

	// too big, we have to allocate it (slow path)
	if (nni_asprintf(&conn->uri, fmt, uri, query) != 0) {
		return (NNG_ENOMEM);
	}
	return (NNG_OK);
}